

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O0

_Bool Curl_cw_out_is_paused(Curl_easy *data)

{
  Curl_cwriter *pCVar1;
  char *pcVar2;
  cw_out_ctx *ctx;
  Curl_cwriter *cw_out;
  Curl_easy *data_local;
  
  pCVar1 = Curl_cwriter_get_by_type(data,&Curl_cwt_out);
  if (pCVar1 == (Curl_cwriter *)0x0) {
    data_local._7_1_ = false;
  }
  else {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       (0 < Curl_trc_feat_write.log_level)) {
      pcVar2 = " not";
      if (((ulong)pCVar1[1].next & 1) != 0) {
        pcVar2 = "";
      }
      Curl_trc_write(data,"cw-out is%spaused",pcVar2);
    }
    data_local._7_1_ = ((ulong)pCVar1[1].next & 1) != 0;
  }
  return data_local._7_1_;
}

Assistant:

bool Curl_cw_out_is_paused(struct Curl_easy *data)
{
  struct Curl_cwriter *cw_out;
  struct cw_out_ctx *ctx;

  cw_out = Curl_cwriter_get_by_type(data, &Curl_cwt_out);
  if(!cw_out)
    return FALSE;

  ctx = (struct cw_out_ctx *)cw_out;
  CURL_TRC_WRITE(data, "cw-out is%spaused", ctx->paused? "" : " not");
  return ctx->paused;
}